

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O0

PrintMenu * __thiscall PrintMenu::findMyType_abi_cxx11_(PrintMenu *this,DishType type)

{
  int in_EDX;
  undefined4 in_register_00000034;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [16];
  allocator local_1d [5];
  undefined8 uStack_18;
  DishType type_local;
  PrintMenu *this_local;
  
  uStack_18 = CONCAT44(in_register_00000034,type);
  this_local = this;
  if (in_EDX == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ALC",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_EDX == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"BVG",local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  else if (in_EDX == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"SPC",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"VEG",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  return this;
}

Assistant:

std::string PrintMenu::findMyType(DishType type)
{
    if (type == ALC)
        return "ALC";
    if(type == BVG)
        return "BVG";
    if (type == SPC)
        return "SPC";
    return "VEG";
}